

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

Aig_Man_t * Saig_ManPerformAbstraction(Saig_Tsim_t *pTsi,int nFrames,int fVerbose)

{
  undefined8 uVar1;
  uint uVar2;
  Aig_Man_t *p;
  int iVar3;
  uint uVar4;
  Aig_Obj_t **pObjMap;
  Aig_Man_t *p_00;
  char *pcVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  ulong uVar9;
  Aig_Obj_t *p1;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  size_t __size;
  long lVar16;
  bool bVar17;
  
  if (pTsi->vNonXRegs->nSize < 1) {
    __assert_fail("Vec_IntSize(pTsi->vNonXRegs) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                  ,0x2f4,"Aig_Man_t *Saig_ManPerformAbstraction(Saig_Tsim_t *, int, int)");
  }
  p = pTsi->pAig;
  lVar16 = (long)nFrames;
  lVar10 = p->vObjs->nSize * lVar16;
  __size = lVar10 * 8;
  pObjMap = (Aig_Obj_t **)malloc(__size);
  lVar13 = 0;
  memset(pObjMap,0,__size);
  p_00 = Aig_ManStart((int)lVar10);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  iVar12 = 0;
  if (0 < nFrames) {
    iVar12 = nFrames;
  }
  for (; iVar12 != (int)lVar13; lVar13 = lVar13 + 1) {
    pObjMap[p->pConst1->Id * lVar16 + lVar13] = p_00->pConst1;
  }
  for (iVar14 = 0; iVar14 != iVar12; iVar14 = iVar14 + 1) {
    for (iVar11 = 0; iVar11 < p->nObjs[2] - p->nRegs; iVar11 = iVar11 + 1) {
      pvVar6 = Vec_PtrEntry(p->vCis,iVar11);
      pAVar7 = Aig_ObjCreateCi(p_00);
      pObjMap[*(int *)((long)pvVar6 + 0x24) * nFrames + iVar14] = pAVar7;
    }
  }
  for (iVar14 = p->nObjs[2] - p->nRegs; iVar14 < p->vCis->nSize; iVar14 = iVar14 + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,iVar14);
    pAVar7 = Aig_ObjCreateCi(p_00);
    pObjMap[*(int *)((long)pvVar6 + 0x24) * lVar16] = pAVar7;
  }
  iVar11 = nFrames + -1;
  iVar14 = 0;
  do {
    iVar15 = iVar14;
    if (iVar15 == iVar12) {
      for (iVar14 = 0; iVar14 != iVar12; iVar14 = iVar14 + 1) {
        for (iVar15 = 0; iVar15 < p->nObjs[3] - p->nRegs; iVar15 = iVar15 + 1) {
          pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar15);
          pAVar8 = Saig_ObjChild0Frames(pObjMap,nFrames,pAVar7,iVar14);
          pAVar8 = Aig_ObjCreateCo(p_00,pAVar8);
          pObjMap[pAVar7->Id * nFrames + iVar14] = pAVar8;
        }
      }
      iVar12 = p->nRegs;
      p_00->nRegs = iVar12;
      uVar1 = *(undefined8 *)(p_00->nObjs + 2);
      p_00->nTruePis = (int)uVar1 - iVar12;
      p_00->nTruePos = (int)((ulong)uVar1 >> 0x20) - iVar12;
      for (iVar12 = p->nObjs[3] - iVar12; iVar12 < p->vCos->nSize; iVar12 = iVar12 + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar12);
        pAVar8 = Saig_ObjChild0Frames(pObjMap,nFrames,pAVar7,iVar11);
        pAVar8 = Aig_ObjCreateCo(p_00,pAVar8);
        pObjMap[pAVar7->Id * nFrames + iVar11] = pAVar8;
      }
      Aig_ManSeqCleanup(p_00);
      free(pObjMap);
      return p_00;
    }
    for (iVar14 = 0; iVar14 < pTsi->vNonXRegs->nSize; iVar14 = iVar14 + 1) {
      iVar3 = Vec_IntEntry(pTsi->vNonXRegs,iVar14);
      pAVar7 = Saig_ManLo(p,iVar3);
      pvVar6 = Vec_PtrEntry(pTsi->vStates,iVar15);
      uVar2 = *(uint *)((long)pvVar6 + (long)(iVar3 >> 4) * 4);
      uVar4 = uVar2 >> (((byte)(iVar3 * 2) & 0x1e) + 1 & 0x1f) & 1;
      bVar17 = (uVar2 >> (iVar3 * 2 & 0x1fU) & 1) != 0;
      if (1 < ((uint)bVar17 + uVar4 * 2) - 1) {
        __assert_fail("Value == SAIG_XVS0 || Value == SAIG_XVS1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                      ,0x312,"Aig_Man_t *Saig_ManPerformAbstraction(Saig_Tsim_t *, int, int)");
      }
      pAVar8 = (Aig_Obj_t *)((ulong)p_00->pConst1 ^ 1);
      if ((uint)bVar17 + uVar4 * 2 == 2) {
        pAVar8 = p_00->pConst1;
      }
      pObjMap[pAVar7->Id * nFrames + iVar15] = pAVar8;
    }
    for (iVar14 = 0; iVar14 < p->vObjs->nSize; iVar14 = iVar14 + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar14);
      if ((pAVar7 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7)) {
        pAVar8 = Saig_ObjChild0Frames(pObjMap,nFrames,pAVar7,iVar15);
        uVar9 = (ulong)pAVar7->pFanin1 & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)pAVar7->pFanin1 & 1) ^
               (ulong)pObjMap[*(int *)(uVar9 + 0x24) * nFrames + iVar15]);
        }
        pAVar8 = Aig_And(p_00,pAVar8,p1);
        pObjMap[pAVar7->Id * nFrames + iVar15] = pAVar8;
      }
    }
    for (iVar3 = 0; iVar14 = iVar15 + 1, iVar3 < p->nRegs; iVar3 = iVar3 + 1) {
      pAVar7 = Aig_ManLi(p,iVar3);
      pAVar8 = Aig_ManLo(p,iVar3);
      if (iVar15 < iVar11) {
        pAVar7 = Saig_ObjChild0Frames(pObjMap,nFrames,pAVar7,iVar15);
        pObjMap[pAVar8->Id * nFrames + iVar15 + 1] = pAVar7;
      }
    }
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManPerformAbstraction( Saig_Tsim_t * pTsi, int nFrames, int fVerbose )
{
    Aig_Man_t * pFrames, * pAig = pTsi->pAig;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    unsigned * pState;
    int i, f, Reg, Value;

    assert( Vec_IntSize(pTsi->vNonXRegs) > 0 );

    // create mapping for the frames nodes
    pObjMap = ABC_ALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );
    memset( pObjMap, 0, sizeof(Aig_Obj_t *) * nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Saig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // create the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Saig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // replace abstracted registers by constants
        Vec_IntForEachEntry( pTsi->vNonXRegs, Reg, i )
        {
            pObj = Saig_ManLo( pAig, Reg );
            pState = (unsigned *)Vec_PtrEntry( pTsi->vStates, f );
            Value = (Abc_InfoHasBit( pState, 2 * Reg + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * Reg );
            assert( Value == SAIG_XVS0 || Value == SAIG_XVS1 );
            pObjNew = (Value == SAIG_XVS1)? Aig_ManConst1(pFrames) : Aig_ManConst0(pFrames);
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i ) 
        {
            pObjNew = Aig_And( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Saig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Saig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Saig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManForEachPoSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,f) );
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
    }
    pFrames->nRegs = pAig->nRegs;
    pFrames->nTruePis = Aig_ManCiNum(pFrames) - Aig_ManRegNum(pFrames); 
    pFrames->nTruePos = Aig_ManCoNum(pFrames) - Aig_ManRegNum(pFrames); 
    Aig_ManForEachLiSeq( pAig, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,nFrames-1) );
        Saig_ObjSetFrames( pObjMap, nFrames, pObj, nFrames-1, pObjNew );
    }
//Aig_ManPrintStats( pFrames );
    Aig_ManSeqCleanup( pFrames );
//Aig_ManPrintStats( pFrames );
//    Aig_ManCiCleanup( pFrames );
//Aig_ManPrintStats( pFrames );
    ABC_FREE( pObjMap );
    return pFrames;
}